

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

uint8_t Image_Function_Helper::GetThreshold
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  value_type vVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  size_type sVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [16];
  undefined1 in_ZMM2 [64];
  double sigma;
  double a;
  double w1;
  uint16_t i_1;
  uint8_t threshold;
  double maximumSigma;
  uint32_t pixelCountTemp;
  uint32_t sumTemp;
  uint16_t i;
  uint32_t sum;
  uint32_t pixelCount;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  ushort uVar13;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  uint8_t uVar14;
  imageException *in_stack_ffffffffffffffd0;
  double dVar15;
  int local_28;
  int local_24;
  ushort local_1e;
  value_type local_1c;
  int local_18;
  
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  if (sVar5 != 0x100) {
    uVar6 = __cxa_allocate_exception(0x28);
    imageException::imageException
              (in_stack_ffffffffffffffd0,
               (char *)CONCAT17(in_stack_ffffffffffffffcf,
                                CONCAT16(in_stack_ffffffffffffffce,
                                         CONCAT24(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8))));
    __cxa_throw(uVar6,&imageException::typeinfo,imageException::~imageException);
  }
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,0);
  vVar1 = *pvVar7;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,1);
  local_18 = vVar1 + *pvVar7;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,1);
  local_1c = *pvVar7;
  for (local_1e = 2; local_1e < 0x100; local_1e = local_1e + 1) {
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_1e);
    local_1c = local_1c + (uint)local_1e * *pvVar7;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)local_1e);
    local_18 = *pvVar7 + local_18;
  }
  local_24 = 0;
  local_28 = 0;
  auVar10 = ZEXT1664(ZEXT816(0xbff0000000000000));
  dVar15 = -1.0;
  uVar14 = '\0';
  uVar13 = 0;
  while( true ) {
    if (0xff < uVar13) {
      return uVar14;
    }
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (in_RDI,(ulong)uVar13);
    auVar12 = in_ZMM2._0_16_;
    auVar11 = in_ZMM1._0_16_;
    auVar8 = auVar10._0_16_;
    local_28 = *pvVar7 + local_28;
    if (local_28 == local_18) break;
    if (local_28 != 0) {
      uVar4 = (uint)uVar13;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (in_RDI,(ulong)uVar13);
      local_24 = uVar4 * *pvVar7 + local_24;
      auVar8 = vcvtusi2sd_avx512f(auVar8,local_28);
      auVar11 = vcvtusi2sd_avx512f(auVar11,local_18);
      auVar9._0_8_ = auVar8._0_8_ / auVar11._0_8_;
      auVar9._8_8_ = auVar8._8_8_;
      auVar8 = vcvtusi2sd_avx512f(auVar9,local_24);
      auVar11 = vcvtusi2sd_avx512f(auVar11,local_28);
      auVar3 = vcvtusi2sd_avx512f(auVar11,local_1c - local_24);
      auVar12 = vcvtusi2sd_avx512f(auVar12,local_18 - local_28);
      in_ZMM2 = ZEXT1664(auVar12);
      dVar2 = auVar8._0_8_ / auVar11._0_8_ - auVar3._0_8_ / auVar12._0_8_;
      in_ZMM1 = ZEXT864((ulong)(1.0 - auVar9._0_8_));
      dVar2 = auVar9._0_8_ * (1.0 - auVar9._0_8_) * dVar2 * dVar2;
      if (dVar15 < dVar2) {
        uVar14 = (uint8_t)uVar13;
        dVar15 = dVar2;
      }
      auVar10 = ZEXT864((ulong)dVar2);
    }
    uVar13 = uVar13 + 1;
  }
  return uVar14;
}

Assistant:

uint8_t GetThreshold( const std::vector < uint32_t > & histogram )
    {
        if( histogram.size() != 256 )
            throw imageException( "Histogram size is not 256" );

        // It is well-known Otsu's method to find threshold
        uint32_t pixelCount = histogram[0] + histogram[1];
        uint32_t sum = histogram[1];
        for( uint16_t i = 2; i < 256; ++i ) {
            sum = sum + i * histogram[i];
            pixelCount += histogram[i];
        }

        uint32_t sumTemp = 0;
        uint32_t pixelCountTemp = 0;

        double maximumSigma = -1;

        uint8_t threshold = 0;

        for( uint16_t i = 0; i < 256; ++i ) {
            pixelCountTemp += histogram[i];

            if( pixelCountTemp == pixelCount )
                break;

            if( pixelCountTemp > 0 ) {
                sumTemp += i * histogram[i];

                const double w1 = static_cast<double>(pixelCountTemp) / pixelCount;
                const double a  = static_cast<double>(sumTemp       ) / pixelCountTemp -
                                  static_cast<double>(sum - sumTemp ) / (pixelCount - pixelCountTemp);
                const double sigma = w1 * (1 - w1) * a * a;

                if( sigma > maximumSigma ) {
                    maximumSigma = sigma;
                    threshold = static_cast <uint8_t>(i);
                }
            }
        }

        return threshold;
    }